

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

char * JS_AtomToCString(JSContext *ctx,JSAtom atom)

{
  JSValue v;
  int iVar1;
  JSValue JVar2;
  char *cstr;
  JSValue str;
  undefined4 in_stack_ffffffffffffffb8;
  JSAtom in_stack_ffffffffffffffbc;
  JSContext *in_stack_ffffffffffffffc0;
  JSValueUnion ctx_00;
  JSValueUnion JVar3;
  undefined8 local_8;
  
  JVar2 = JS_AtomToString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  ctx_00 = JVar2.u;
  JVar3 = (JSValueUnion)JVar2.tag;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    JVar2.u._4_4_ = in_stack_ffffffffffffffbc;
    JVar2.u.int32 = in_stack_ffffffffffffffb8;
    JVar2.tag = (int64_t)ctx_00.ptr;
    local_8 = JS_ToCString((JSContext *)0x121eac,JVar2);
    v.tag = (int64_t)local_8;
    v.u.float64 = JVar3.float64;
    JS_FreeValue((JSContext *)ctx_00.ptr,v);
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *JS_AtomToCString(JSContext *ctx, JSAtom atom)
{
    JSValue str;
    const char *cstr;

    str = JS_AtomToString(ctx, atom);
    if (JS_IsException(str))
        return NULL;
    cstr = JS_ToCString(ctx, str);
    JS_FreeValue(ctx, str);
    return cstr;
}